

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86instapi.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::x86::InstInternal::rwHandleAVX512
          (InstInternal *this,BaseInst *inst,CommonInfo *commonInfo,InstRWInfo *out)

{
  uint64_t *puVar1;
  ulong in_RAX;
  
  if ((((uint)inst & 0xf8) == 0x88) && (out->_opCount != '\0')) {
    *(undefined1 *)&(out->_extraReg)._opFlags = (char)(out->_extraReg)._opFlags | kRead;
    (out->_extraReg)._readByteMask = 0xff;
    if ((((uint)this >> 0x17 & 1) == 0) && ((commonInfo->field_0x5 & 1) == 0)) {
      *(undefined1 *)&out->_operands[0]._opFlags = (char)out->_operands[0]._opFlags | kRead;
      in_RAX = out->_operands[0]._writeByteMask;
      puVar1 = &out->_operands[0]._readByteMask;
      *puVar1 = *puVar1 | in_RAX;
    }
  }
  return (Error)in_RAX;
}

Assistant:

static ASMJIT_FORCE_INLINE Error rwHandleAVX512(const BaseInst& inst, const InstDB::CommonInfo& commonInfo, InstRWInfo* out) noexcept {
  if (inst.hasExtraReg() && inst.extraReg().type() == RegType::kX86_KReg && out->opCount() > 0) {
    // AVX-512 instruction that uses a destination with {k} register (zeroing vs masking).
    out->_extraReg.addOpFlags(OpRWFlags::kRead);
    out->_extraReg.setReadByteMask(0xFF);
    if (!inst.hasOption(InstOptions::kX86_ZMask) && !commonInfo.hasAvx512Flag(InstDB::Avx512Flags::kImplicitZ)) {
      out->_operands[0].addOpFlags(OpRWFlags::kRead);
      out->_operands[0]._readByteMask |= out->_operands[0]._writeByteMask;
    }
  }

  return kErrorOk;
}